

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 *puVar24;
  void *pvVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  undefined1 (*pauVar34) [32];
  int iVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  uint uVar45;
  size_t *psVar46;
  long lVar47;
  undefined1 (*pauVar48) [16];
  long lVar49;
  long lVar50;
  undefined1 (*pauVar51) [16];
  undefined1 (*pauVar52) [32];
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long local_158;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f0;
  long local_e0;
  long local_d8;
  long local_c0;
  
  iVar35 = B->elempack;
  psVar46 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar46 = &B->cstep;
  }
  iVar6 = (int)*psVar46;
  pauVar52 = (undefined1 (*) [32])BT->data;
  lVar44 = 0;
  lVar58 = (long)k;
  lVar36 = (long)j;
  lVar56 = (long)iVar6;
  if (0xb < max_jj) {
    lVar28 = (long)(k * 4) * 4;
    lVar54 = lVar28 + lVar56 * lVar36 * 4;
    lVar43 = (lVar36 + 4) * lVar56;
    lVar39 = lVar28 + lVar43 * 4;
    lVar30 = (lVar36 + 8) * lVar56;
    lVar28 = lVar28 + lVar30 * 4;
    lVar47 = lVar58 * 4;
    lVar41 = lVar47 + lVar56 * lVar36 * 4;
    lVar40 = lVar56 * 0x30;
    lVar32 = lVar56 * 4;
    lVar50 = 0;
    lVar29 = 0;
    do {
      if (iVar35 == 8) {
        uVar37 = (int)lVar29 + j;
        uVar45 = (int)lVar29 + 7 + j;
        if (-1 < (int)uVar37) {
          uVar45 = uVar37;
        }
        uVar45 = uVar45 & 0xfffffff8;
        puVar24 = (undefined8 *)
                  ((long)B->data + (long)(k * 8) * 4 + (long)(int)(uVar45 * iVar6) * 4);
        pauVar48 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 8) * 4 + (long)(int)((uVar45 + 8) * iVar6) * 4);
        iVar42 = max_kk;
        if (uVar37 == uVar45 && 0 < max_kk) {
          do {
            uVar21 = puVar24[1];
            uVar22 = puVar24[2];
            uVar23 = puVar24[3];
            *(undefined8 *)*pauVar52 = *puVar24;
            *(undefined8 *)(*pauVar52 + 8) = uVar21;
            *(undefined8 *)(*pauVar52 + 0x10) = uVar22;
            *(undefined8 *)(*pauVar52 + 0x18) = uVar23;
            *(undefined1 (*) [16])pauVar52[1] = *pauVar48;
            pauVar52 = (undefined1 (*) [32])(pauVar52[1] + 0x10);
            puVar24 = puVar24 + 4;
            pauVar48 = pauVar48 + 2;
            iVar42 = iVar42 + -1;
          } while (iVar42 != 0);
        }
        if (uVar37 - uVar45 == 4 && 0 < max_kk) {
          lVar44 = 0;
          iVar42 = max_kk;
          do {
            puVar1 = (undefined8 *)((long)puVar24 + lVar44 + 0x10);
            uVar21 = puVar1[1];
            *(undefined8 *)*pauVar52 = *puVar1;
            *(undefined8 *)(*pauVar52 + 8) = uVar21;
            *(undefined1 (*) [32])(*pauVar52 + 0x10) = *(undefined1 (*) [32])(*pauVar48 + lVar44);
            pauVar52 = (undefined1 (*) [32])(pauVar52[1] + 0x10);
            lVar44 = lVar44 + 0x20;
            iVar42 = iVar42 + -1;
          } while (iVar42 != 0);
        }
      }
      if (0 < max_kk && iVar35 == 4) {
        pvVar25 = B->data;
        iVar42 = max_kk;
        do {
          uVar21 = ((undefined8 *)((long)pvVar25 + lVar54))[1];
          *(undefined8 *)*pauVar52 = *(undefined8 *)((long)pvVar25 + lVar54);
          *(undefined8 *)(*pauVar52 + 8) = uVar21;
          uVar21 = ((undefined8 *)((long)pvVar25 + lVar39))[1];
          *(undefined8 *)(*pauVar52 + 0x10) = *(undefined8 *)((long)pvVar25 + lVar39);
          *(undefined8 *)(*pauVar52 + 0x18) = uVar21;
          *(undefined1 (*) [16])pauVar52[1] = *(undefined1 (*) [16])((long)pvVar25 + lVar28);
          pauVar52 = (undefined1 (*) [32])(pauVar52[1] + 0x10);
          pvVar25 = (void *)((long)pvVar25 + 0x10);
          iVar42 = iVar42 + -1;
        } while (iVar42 != 0);
      }
      if (iVar35 == 1) {
        pvVar25 = B->data;
        if (max_kk < 8) {
          uVar45 = 0;
          local_118 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36) * lVar56 * 4;
          local_d8 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 1) * lVar56 * 4;
          lVar44 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 2) * lVar56 * 4;
          local_120 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 3) * lVar56 * 4;
          local_e0 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 4) * lVar56 * 4;
          local_f0 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 5) * lVar56 * 4;
          lVar57 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 6) * lVar56 * 4;
          lVar38 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 7) * lVar56 * 4;
          lVar55 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 8) * lVar56 * 4;
          lVar33 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 9) * lVar56 * 4;
          local_158 = (long)pvVar25 + lVar58 * 4 + (lVar29 + lVar36 + 10) * lVar56 * 4;
          lVar26 = (long)pvVar25 + lVar58 * 4 + (lVar36 + lVar29 + 0xb) * lVar56 * 4;
        }
        else {
          lVar26 = (long)pvVar25 + lVar50;
          iVar42 = 7;
          do {
            lVar44 = lVar26 + lVar41;
            lVar57 = lVar44 + lVar56 * 8;
            auVar2 = *(undefined1 (*) [32])(lVar44 + lVar56 * 4);
            auVar59 = *(undefined1 (*) [32])(lVar44 + lVar56 * 8);
            auVar60 = *(undefined1 (*) [32])(lVar57 + lVar56 * 4);
            lVar38 = lVar56 * 8 + lVar57;
            auVar3 = *(undefined1 (*) [32])(lVar57 + lVar56 * 8);
            lVar44 = lVar38 + lVar56 * 4;
            auVar4 = *(undefined1 (*) [32])(lVar38 + lVar56 * 4);
            auVar61 = *(undefined1 (*) [32])(lVar32 + lVar44);
            lVar44 = lVar44 + lVar32;
            auVar5 = *(undefined1 (*) [32])(lVar32 + lVar44);
            lVar44 = lVar44 + lVar32;
            auVar62 = *(undefined1 (*) [32])(lVar32 + lVar44);
            lVar44 = lVar44 + lVar32;
            auVar65 = *(undefined1 (*) [32])(lVar32 + lVar44);
            lVar44 = lVar44 + lVar32;
            auVar64 = *(undefined1 (*) [32])(lVar32 + lVar44);
            auVar71 = *(undefined1 (*) [32])(lVar44 + lVar56 * 8);
            auVar66 = vunpcklps_avx(*(undefined1 (*) [32])(lVar26 + lVar41),auVar2);
            auVar63 = vunpckhps_avx(*(undefined1 (*) [32])(lVar26 + lVar41),auVar2);
            auVar2 = vunpcklps_avx(auVar59,auVar60);
            auVar59 = vunpckhps_avx(auVar59,auVar60);
            auVar60 = vunpcklps_avx(auVar3,auVar4);
            auVar3 = vunpckhps_avx(auVar3,auVar4);
            auVar67 = vunpcklps_avx(auVar61,auVar5);
            auVar4 = vunpckhps_avx(auVar61,auVar5);
            auVar69 = vunpcklps_avx(auVar62,auVar65);
            auVar61 = vunpckhps_avx(auVar62,auVar65);
            auVar68 = vunpcklps_avx(auVar64,auVar71);
            auVar5 = vunpckhps_avx(auVar64,auVar71);
            auVar62 = vunpcklpd_avx(auVar66,auVar2);
            auVar2 = vunpckhpd_avx(auVar66,auVar2);
            auVar65 = vunpcklpd_avx(auVar63,auVar59);
            auVar59 = vunpckhpd_avx(auVar63,auVar59);
            auVar64 = vunpcklpd_avx(auVar60,auVar67);
            auVar60 = vunpckhpd_avx(auVar60,auVar67);
            auVar71 = vunpcklpd_avx(auVar3,auVar4);
            auVar3 = vunpckhpd_avx(auVar3,auVar4);
            auVar63 = vunpcklpd_avx(auVar69,auVar68);
            auVar4 = vunpckhpd_avx(auVar69,auVar68);
            auVar66 = vunpcklpd_avx(auVar61,auVar5);
            auVar61 = vunpckhpd_avx(auVar61,auVar5);
            auVar67._16_16_ = auVar64._0_16_;
            auVar67._0_16_ = auVar62._0_16_;
            auVar5 = vperm2f128_avx(auVar62,auVar64,0x31);
            auVar69._16_16_ = auVar2._0_16_;
            auVar69._0_16_ = auVar63._0_16_;
            auVar2 = vperm2f128_avx(auVar63,auVar2,0x31);
            auVar62._16_16_ = auVar4._0_16_;
            auVar62._0_16_ = auVar60._0_16_;
            auVar60 = vperm2f128_avx(auVar60,auVar4,0x31);
            auVar64._16_16_ = auVar71._0_16_;
            auVar64._0_16_ = auVar65._0_16_;
            auVar4 = vperm2f128_avx(auVar65,auVar71,0x31);
            auVar71._16_16_ = auVar59._0_16_;
            auVar71._0_16_ = auVar66._0_16_;
            auVar59 = vperm2f128_avx(auVar66,auVar59,0x31);
            auVar65._16_16_ = auVar61._0_16_;
            auVar65._0_16_ = auVar3._0_16_;
            auVar3 = vperm2f128_avx(auVar3,auVar61,0x31);
            *pauVar52 = auVar67;
            pauVar52[1] = auVar69;
            pauVar52[2] = auVar62;
            pauVar52[3] = auVar64;
            pauVar52[4] = auVar71;
            pauVar52[5] = auVar65;
            pauVar52[6] = auVar5;
            pauVar52[7] = auVar2;
            pauVar52[8] = auVar60;
            pauVar52[9] = auVar4;
            pauVar52[10] = auVar59;
            pauVar52[0xb] = auVar3;
            pauVar52 = pauVar52 + 0xc;
            lVar26 = lVar26 + 0x20;
            iVar42 = iVar42 + 8;
          } while (iVar42 < max_kk);
          local_118 = lVar26 + lVar41;
          local_d8 = lVar47 + (lVar36 + 1) * lVar56 * 4 + lVar26;
          lVar44 = lVar26 + lVar47 + (lVar36 + 2) * lVar56 * 4;
          local_120 = lVar26 + lVar47 + (lVar36 + 3) * lVar56 * 4;
          local_e0 = lVar26 + lVar47 + lVar43 * 4;
          local_f0 = lVar26 + lVar47 + (lVar36 + 5) * lVar56 * 4;
          lVar57 = lVar26 + lVar47 + (lVar36 + 6) * lVar56 * 4;
          lVar38 = lVar26 + lVar47 + (lVar36 + 7) * lVar56 * 4;
          lVar55 = lVar26 + lVar47 + lVar30 * 4;
          lVar33 = lVar26 + lVar47 + (lVar36 + 9) * lVar56 * 4;
          local_158 = lVar47 + (lVar36 + 10) * lVar56 * 4 + lVar26;
          lVar26 = lVar26 + lVar47 + (lVar36 + 0xb) * lVar56 * 4;
          uVar45 = max_kk & 0xfffffff8;
        }
        if ((int)(uVar45 | 3) < max_kk) {
          lVar49 = 0;
          uVar37 = uVar45;
          do {
            auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(local_118 + lVar49),
                                    *(undefined1 (*) [16])(local_d8 + lVar49));
            auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(lVar44 + lVar49),
                                    *(undefined1 (*) [16])(local_120 + lVar49));
            auVar12 = vunpckhps_avx(*(undefined1 (*) [16])(local_118 + lVar49),
                                    *(undefined1 (*) [16])(local_d8 + lVar49));
            auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(lVar44 + lVar49),
                                    *(undefined1 (*) [16])(local_120 + lVar49));
            auVar8 = vmovlhps_avx(auVar17,auVar18);
            auVar9 = vunpckhpd_avx(auVar17,auVar18);
            auVar17 = vmovlhps_avx(auVar12,auVar13);
            auVar10 = vunpckhpd_avx(auVar12,auVar13);
            auVar13 = vunpcklps_avx(*(undefined1 (*) [16])(local_e0 + lVar49),
                                    *(undefined1 (*) [16])(local_f0 + lVar49));
            auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(lVar57 + lVar49),
                                    *(undefined1 (*) [16])(lVar38 + lVar49));
            auVar18 = vunpckhps_avx(*(undefined1 (*) [16])(local_e0 + lVar49),
                                    *(undefined1 (*) [16])(local_f0 + lVar49));
            auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(lVar57 + lVar49),
                                    *(undefined1 (*) [16])(lVar38 + lVar49));
            auVar12 = vmovlhps_avx(auVar13,auVar19);
            auVar19 = vunpckhpd_avx(auVar13,auVar19);
            auVar13 = vmovlhps_avx(auVar18,auVar14);
            auVar11 = vunpckhpd_avx(auVar18,auVar14);
            auVar14 = vunpcklps_avx(*(undefined1 (*) [16])(lVar55 + lVar49),
                                    *(undefined1 (*) [16])(lVar33 + lVar49));
            auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(local_158 + lVar49),
                                    *(undefined1 (*) [16])(lVar26 + lVar49));
            auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(lVar55 + lVar49),
                                    *(undefined1 (*) [16])(lVar33 + lVar49));
            auVar16 = vunpckhps_avx(*(undefined1 (*) [16])(local_158 + lVar49),
                                    *(undefined1 (*) [16])(lVar26 + lVar49));
            auVar18 = vmovlhps_avx(auVar14,auVar20);
            auVar20 = vunpckhpd_avx(auVar14,auVar20);
            auVar14 = vmovlhps_avx(auVar15,auVar16);
            auVar15 = vunpckhpd_avx(auVar15,auVar16);
            *(undefined1 (*) [16])*pauVar52 = auVar8;
            *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar12;
            *(undefined1 (*) [16])pauVar52[1] = auVar18;
            *(undefined1 (*) [16])(pauVar52[1] + 0x10) = auVar9;
            *(undefined1 (*) [16])pauVar52[2] = auVar19;
            *(undefined1 (*) [16])(pauVar52[2] + 0x10) = auVar20;
            *(undefined1 (*) [16])pauVar52[3] = auVar17;
            *(undefined1 (*) [16])(pauVar52[3] + 0x10) = auVar13;
            *(undefined1 (*) [16])pauVar52[4] = auVar14;
            *(undefined1 (*) [16])(pauVar52[4] + 0x10) = auVar10;
            *(undefined1 (*) [16])pauVar52[5] = auVar11;
            *(undefined1 (*) [16])(pauVar52[5] + 0x10) = auVar15;
            pauVar52 = pauVar52 + 6;
            uVar45 = uVar37 + 4;
            lVar49 = lVar49 + 0x10;
            iVar42 = uVar37 + 7;
            uVar37 = uVar45;
          } while (iVar42 < max_kk);
          local_118 = local_118 + lVar49;
          local_d8 = local_d8 + lVar49;
          lVar44 = lVar44 + lVar49;
          local_120 = local_120 + lVar49;
          local_e0 = local_e0 + lVar49;
          local_f0 = local_f0 + lVar49;
          lVar57 = lVar57 + lVar49;
          lVar38 = lVar38 + lVar49;
          lVar55 = lVar55 + lVar49;
          lVar33 = lVar33 + lVar49;
          local_158 = local_158 + lVar49;
          lVar26 = lVar26 + lVar49;
        }
        if ((int)uVar45 < max_kk) {
          lVar49 = 0;
          do {
            *(undefined4 *)*pauVar52 = *(undefined4 *)(local_118 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 4) = *(undefined4 *)(local_d8 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 8) = *(undefined4 *)(lVar44 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 0xc) = *(undefined4 *)(local_120 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 0x10) = *(undefined4 *)(local_e0 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 0x14) = *(undefined4 *)(local_f0 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 0x18) = *(undefined4 *)(lVar57 + lVar49 * 4);
            *(undefined4 *)(*pauVar52 + 0x1c) = *(undefined4 *)(lVar38 + lVar49 * 4);
            *(undefined4 *)pauVar52[1] = *(undefined4 *)(lVar55 + lVar49 * 4);
            *(undefined4 *)(pauVar52[1] + 4) = *(undefined4 *)(lVar33 + lVar49 * 4);
            *(undefined4 *)(pauVar52[1] + 8) = *(undefined4 *)(local_158 + lVar49 * 4);
            *(undefined4 *)(pauVar52[1] + 0xc) = *(undefined4 *)(lVar26 + lVar49 * 4);
            pauVar52 = (undefined1 (*) [32])(pauVar52[1] + 0x10);
            lVar49 = lVar49 + 1;
          } while (max_kk - uVar45 != (int)lVar49);
        }
      }
      lVar44 = lVar29 + 0xc;
      uVar31 = lVar29 + 0x17;
      lVar54 = lVar54 + lVar40;
      lVar39 = lVar39 + lVar40;
      lVar28 = lVar28 + lVar40;
      lVar50 = lVar50 + lVar40;
      lVar29 = lVar44;
    } while (uVar31 < (uint)max_jj);
  }
  lVar54 = (long)max_jj;
  if ((int)lVar44 + 7 < max_jj) {
    lVar47 = (long)(int)lVar44;
    lVar44 = (lVar47 + lVar36) * lVar56;
    lVar28 = (long)(k * 4) * 4;
    lVar39 = lVar28 + lVar44 * 4;
    lVar32 = (lVar47 + lVar36 + 4) * lVar56;
    lVar28 = lVar28 + lVar32 * 4;
    lVar41 = lVar58 * 4;
    local_100 = lVar41 + (lVar47 + lVar36 + 7) * lVar56 * 4;
    local_108 = lVar41 + (lVar47 + lVar36 + 6) * lVar56 * 4;
    local_110 = lVar41 + (lVar47 + lVar36 + 5) * lVar56 * 4;
    local_118 = lVar41 + lVar32 * 4;
    local_120 = lVar41 + (lVar47 + lVar36 + 3) * lVar56 * 4;
    local_f0 = lVar41 + (lVar47 + lVar36 + 2) * lVar56 * 4;
    local_c0 = lVar41 + (lVar47 + lVar36 + 1) * lVar56 * 4;
    lVar41 = lVar41 + lVar44 * 4;
    lVar32 = lVar56 * 0x20;
    do {
      if (iVar35 == 8) {
        iVar42 = (int)lVar47;
        uVar37 = iVar42 + j;
        uVar45 = iVar42 + 7 + j;
        if (-1 < (int)uVar37) {
          uVar45 = uVar37;
        }
        pvVar25 = B->data;
        pauVar27 = (undefined1 (*) [32])
                   ((long)pvVar25 + (long)(k * 8) * 4 + (long)(((int)uVar45 >> 3) * iVar6 * 8) * 4);
        iVar53 = iVar42 + j + 8;
        iVar42 = j + iVar42 + 0xf;
        if (-1 < iVar53) {
          iVar42 = iVar53;
        }
        iVar53 = max_kk;
        if (uVar37 == (uVar45 & 0xfffffff8) && 0 < max_kk) {
          do {
            *pauVar52 = *pauVar27;
            pauVar52 = pauVar52 + 1;
            pauVar27 = pauVar27 + 1;
            iVar53 = iVar53 + -1;
          } while (iVar53 != 0);
        }
        if (uVar37 - (uVar45 & 0xfffffff8) == 4 && 0 < max_kk) {
          lVar44 = 0;
          iVar53 = max_kk;
          do {
            lVar40 = lVar44;
            uVar21 = *(undefined8 *)((long)(*pauVar27 + lVar40 + 0x10) + 8);
            *(undefined8 *)(*pauVar52 + lVar40) = *(undefined8 *)(*pauVar27 + lVar40 + 0x10);
            *(undefined8 *)((long)(*pauVar52 + lVar40) + 8) = uVar21;
            *(undefined1 (*) [16])(*pauVar52 + lVar40 + 0x10) =
                 *(undefined1 (*) [16])
                  ((long)pvVar25 +
                  lVar40 + (long)(k * 8) * 4 + (long)((iVar42 >> 3) * iVar6 * 8) * 4);
            iVar53 = iVar53 + -1;
            lVar44 = lVar40 + 0x20;
          } while (iVar53 != 0);
          pauVar52 = (undefined1 (*) [32])(pauVar52[1] + lVar40);
        }
      }
      if (0 < max_kk && iVar35 == 4) {
        pvVar25 = B->data;
        iVar42 = max_kk;
        do {
          uVar21 = ((undefined8 *)((long)pvVar25 + lVar39))[1];
          *(undefined8 *)*pauVar52 = *(undefined8 *)((long)pvVar25 + lVar39);
          *(undefined8 *)(*pauVar52 + 8) = uVar21;
          *(undefined1 (*) [16])(*pauVar52 + 0x10) = *(undefined1 (*) [16])((long)pvVar25 + lVar28);
          pauVar52 = pauVar52 + 1;
          pvVar25 = (void *)((long)pvVar25 + 0x10);
          iVar42 = iVar42 + -1;
        } while (iVar42 != 0);
      }
      if (iVar35 == 1) {
        pvVar25 = B->data;
        if (max_kk < 8) {
          uVar45 = 0;
          lVar44 = lVar58 * 4 + (lVar47 + lVar36) * lVar56 * 4;
          lVar38 = lVar58 * 4 + (lVar47 + lVar36 + 1) * lVar56 * 4;
          lVar57 = lVar58 * 4 + (lVar47 + lVar36 + 2) * lVar56 * 4;
          lVar50 = lVar58 * 4 + (lVar47 + lVar36 + 3) * lVar56 * 4;
          lVar43 = lVar58 * 4 + (lVar47 + lVar36 + 4) * lVar56 * 4;
          lVar30 = lVar58 * 4 + (lVar47 + lVar36 + 5) * lVar56 * 4;
          lVar29 = lVar58 * 4 + (lVar47 + lVar36 + 6) * lVar56 * 4;
          lVar40 = lVar58 * 4 + (lVar47 + lVar36 + 7) * lVar56 * 4;
        }
        else {
          iVar42 = 7;
          lVar44 = 0;
          pauVar27 = pauVar52;
          do {
            pauVar34 = pauVar27;
            pauVar27 = (undefined1 (*) [32])(*pauVar52 + lVar44 * 8);
            lVar40 = lVar44 + lVar41;
            auVar2 = *(undefined1 (*) [32])((long)pvVar25 + lVar44 + lVar41);
            lVar29 = lVar56 * 8 + lVar40;
            auVar59 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 4 + lVar40);
            auVar60 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 8 + lVar40);
            auVar3 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 4 + lVar29);
            lVar40 = lVar56 * 8 + lVar29;
            auVar4 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 8 + lVar29);
            lVar29 = lVar56 * 4 + lVar40;
            auVar61 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 4 + lVar40);
            auVar5 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 4 + lVar29);
            auVar62 = *(undefined1 (*) [32])((long)pvVar25 + lVar56 * 8 + lVar29);
            auVar65 = vunpcklps_avx(auVar2,auVar59);
            auVar59 = vunpckhps_avx(auVar2,auVar59);
            auVar2 = vunpcklps_avx(auVar60,auVar3);
            auVar60 = vunpckhps_avx(auVar60,auVar3);
            auVar64 = vunpcklps_avx(auVar4,auVar61);
            auVar3 = vunpckhps_avx(auVar4,auVar61);
            auVar71 = vunpcklps_avx(auVar5,auVar62);
            auVar4 = vunpckhps_avx(auVar5,auVar62);
            auVar61 = vunpcklpd_avx(auVar65,auVar2);
            auVar2 = vunpckhpd_avx(auVar65,auVar2);
            auVar5 = vunpcklpd_avx(auVar59,auVar60);
            auVar59 = vunpckhpd_avx(auVar59,auVar60);
            auVar62 = vunpcklpd_avx(auVar64,auVar71);
            auVar60 = vunpckhpd_avx(auVar64,auVar71);
            auVar65 = vunpcklpd_avx(auVar3,auVar4);
            auVar3 = vunpckhpd_avx(auVar3,auVar4);
            auVar63._16_16_ = auVar62._0_16_;
            auVar63._0_16_ = auVar61._0_16_;
            auVar66._16_16_ = auVar60._0_16_;
            auVar66._0_16_ = auVar2._0_16_;
            auVar68._16_16_ = auVar65._0_16_;
            auVar68._0_16_ = auVar5._0_16_;
            auVar70._16_16_ = auVar3._0_16_;
            auVar70._0_16_ = auVar59._0_16_;
            auVar4 = vperm2f128_avx(auVar61,auVar62,0x31);
            auVar2 = vperm2f128_avx(auVar2,auVar60,0x31);
            auVar60 = vperm2f128_avx(auVar5,auVar65,0x31);
            auVar59 = vperm2f128_avx(auVar59,auVar3,0x31);
            *pauVar27 = auVar63;
            pauVar27[1] = auVar66;
            pauVar27[2] = auVar68;
            pauVar27[3] = auVar70;
            pauVar27[4] = auVar4;
            pauVar27[5] = auVar2;
            pauVar27[6] = auVar60;
            pauVar27[7] = auVar59;
            lVar44 = lVar44 + 0x20;
            iVar42 = iVar42 + 8;
            pauVar27 = pauVar27 + 8;
          } while (iVar42 < max_kk);
          pauVar52 = pauVar34 + 8;
          lVar40 = lVar44 + local_100;
          lVar29 = lVar44 + local_108;
          lVar30 = lVar44 + local_110;
          lVar43 = lVar44 + local_118;
          lVar50 = lVar44 + local_120;
          lVar57 = lVar44 + local_f0;
          lVar38 = lVar44 + local_c0;
          lVar44 = lVar44 + lVar41;
          uVar45 = max_kk & 0xfffffff8;
        }
        lVar30 = (long)pvVar25 + lVar30;
        lVar57 = (long)pvVar25 + lVar57;
        lVar44 = (long)pvVar25 + lVar44;
        lVar38 = (long)pvVar25 + lVar38;
        lVar40 = (long)pvVar25 + lVar40;
        lVar43 = (long)pvVar25 + lVar43;
        lVar50 = (long)pvVar25 + lVar50;
        lVar29 = (long)pvVar25 + lVar29;
        if ((int)(uVar45 | 3) < max_kk) {
          lVar33 = 0;
          lVar55 = 0;
          uVar37 = uVar45;
          do {
            lVar26 = lVar55;
            auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(lVar44 + lVar33),
                                    *(undefined1 (*) [16])(lVar38 + lVar33));
            auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(lVar57 + lVar33),
                                    *(undefined1 (*) [16])(lVar50 + lVar33));
            auVar12 = vunpckhps_avx(*(undefined1 (*) [16])(lVar44 + lVar33),
                                    *(undefined1 (*) [16])(lVar38 + lVar33));
            auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(lVar57 + lVar33),
                                    *(undefined1 (*) [16])(lVar50 + lVar33));
            auVar8 = vmovlhps_avx(auVar17,auVar18);
            auVar18 = vunpckhpd_avx(auVar17,auVar18);
            auVar17 = vmovlhps_avx(auVar12,auVar13);
            auVar14 = vunpckhpd_avx(auVar12,auVar13);
            auVar13 = vunpcklps_avx(*(undefined1 (*) [16])(lVar43 + lVar33),
                                    *(undefined1 (*) [16])(lVar30 + lVar33));
            auVar9 = vunpcklps_avx(*(undefined1 (*) [16])(lVar29 + lVar33),
                                   *(undefined1 (*) [16])(lVar40 + lVar33));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [16])(lVar43 + lVar33),
                                    *(undefined1 (*) [16])(lVar30 + lVar33));
            auVar19 = vunpckhps_avx(*(undefined1 (*) [16])(lVar29 + lVar33),
                                    *(undefined1 (*) [16])(lVar40 + lVar33));
            auVar12 = vmovlhps_avx(auVar13,auVar9);
            auVar9 = vunpckhpd_avx(auVar13,auVar9);
            auVar13 = vmovlhps_avx(auVar10,auVar19);
            auVar10 = vunpckhpd_avx(auVar10,auVar19);
            *(undefined1 (*) [16])(*pauVar52 + lVar33 * 8) = auVar8;
            *(undefined1 (*) [16])(*pauVar52 + lVar33 * 8 + 0x10) = auVar12;
            *(undefined1 (*) [16])(pauVar52[1] + lVar33 * 8) = auVar18;
            *(undefined1 (*) [16])(pauVar52[1] + lVar33 * 8 + 0x10) = auVar9;
            *(undefined1 (*) [16])(pauVar52[2] + lVar33 * 8) = auVar17;
            *(undefined1 (*) [16])(pauVar52[2] + lVar33 * 8 + 0x10) = auVar13;
            *(undefined1 (*) [16])(pauVar52[3] + lVar33 * 8) = auVar14;
            *(undefined1 (*) [16])(pauVar52[3] + lVar33 * 8 + 0x10) = auVar10;
            uVar45 = uVar37 + 4;
            lVar33 = lVar33 + 0x10;
            iVar42 = uVar37 + 7;
            lVar55 = lVar26 + 0x80;
            uVar37 = uVar45;
          } while (iVar42 < max_kk);
          pauVar52 = (undefined1 (*) [32])(pauVar52[4] + lVar26);
          lVar40 = lVar40 + lVar33;
          lVar29 = lVar29 + lVar33;
          lVar30 = lVar30 + lVar33;
          lVar43 = lVar43 + lVar33;
          lVar50 = lVar50 + lVar33;
          lVar57 = lVar57 + lVar33;
          lVar38 = lVar38 + lVar33;
          lVar44 = lVar44 + lVar33;
        }
        iVar42 = max_kk - uVar45;
        if (iVar42 != 0 && (int)uVar45 <= max_kk) {
          lVar55 = 0;
          lVar33 = 0;
          do {
            *(undefined4 *)(*pauVar52 + lVar33 * 8) = *(undefined4 *)(lVar44 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 4) = *(undefined4 *)(lVar38 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 8) = *(undefined4 *)(lVar57 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 0xc) = *(undefined4 *)(lVar50 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 0x10) = *(undefined4 *)(lVar43 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 0x14) = *(undefined4 *)(lVar30 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 0x18) = *(undefined4 *)(lVar29 + lVar33);
            *(undefined4 *)(*pauVar52 + lVar33 * 8 + 0x1c) = *(undefined4 *)(lVar40 + lVar33);
            lVar33 = lVar33 + 4;
            lVar55 = lVar55 + -0x20;
            iVar42 = iVar42 + -1;
          } while (iVar42 != 0);
          pauVar52 = (undefined1 (*) [32])((long)pauVar52 - lVar55);
        }
      }
      lVar44 = lVar47 + 8;
      lVar39 = lVar39 + lVar32;
      lVar28 = lVar28 + lVar32;
      local_100 = local_100 + lVar32;
      local_108 = local_108 + lVar32;
      local_110 = local_110 + lVar32;
      local_118 = local_118 + lVar32;
      local_120 = local_120 + lVar32;
      local_f0 = local_f0 + lVar32;
      local_c0 = local_c0 + lVar32;
      lVar41 = lVar41 + lVar32;
      bVar7 = lVar47 < lVar54 + -0xf;
      lVar47 = lVar44;
    } while (bVar7);
  }
  if ((int)((uint)lVar44 | 3) < max_jj) {
    lVar32 = (long)(int)(uint)lVar44;
    lVar47 = lVar58 * 4;
    lVar39 = lVar47 + (lVar32 + lVar36 + 3) * lVar56 * 4;
    lVar40 = lVar56 * 0x10;
    lVar28 = lVar47 + (lVar32 + lVar36 + 2) * lVar56 * 4;
    lVar41 = lVar47 + (lVar32 + lVar36 + 1) * lVar56 * 4;
    lVar47 = lVar47 + (lVar32 + lVar36) * lVar56 * 4;
    do {
      if (iVar35 == 8) {
        uVar37 = (int)lVar32 + j;
        uVar45 = (int)lVar32 + 7 + j;
        if (-1 < (int)uVar37) {
          uVar45 = uVar37;
        }
        pauVar48 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 8) * 4 + (long)(((int)uVar45 >> 3) * iVar6 * 8) * 4);
        iVar42 = max_kk;
        if (uVar37 == (uVar45 & 0xfffffff8) && 0 < max_kk) {
          do {
            *(undefined1 (*) [16])*pauVar52 = *pauVar48;
            pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
            pauVar48 = pauVar48 + 2;
            iVar42 = iVar42 + -1;
          } while (iVar42 != 0);
        }
        if (uVar37 - (uVar45 & 0xfffffff8) == 4 && 0 < max_kk) {
          pauVar48 = pauVar48 + 1;
          iVar42 = max_kk;
          do {
            *(undefined1 (*) [16])*pauVar52 = *pauVar48;
            pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
            pauVar48 = pauVar48 + 2;
            iVar42 = iVar42 + -1;
          } while (iVar42 != 0);
        }
      }
      if (0 < max_kk && iVar35 == 4) {
        pauVar48 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 4) * 4 + (lVar36 + lVar32) * lVar56 * 4);
        iVar42 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar52 = *pauVar48;
          pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
          pauVar48 = pauVar48 + 1;
          iVar42 = iVar42 + -1;
        } while (iVar42 != 0);
      }
      if (iVar35 == 1) {
        pvVar25 = B->data;
        if (max_kk < 8) {
          uVar45 = 0;
          lVar43 = lVar58 * 4 + (lVar36 + lVar32) * lVar56 * 4;
          lVar30 = lVar58 * 4 + (lVar36 + lVar32 + 1) * lVar56 * 4;
          lVar29 = lVar58 * 4 + (lVar36 + lVar32 + 2) * lVar56 * 4;
          lVar44 = lVar58 * 4 + (lVar36 + lVar32 + 3) * lVar56 * 4;
        }
        else {
          iVar42 = 7;
          lVar43 = 0;
          pauVar27 = pauVar52;
          do {
            pauVar34 = pauVar27;
            pauVar27 = (undefined1 (*) [32])(*pauVar52 + lVar43 * 4);
            auVar2 = *(undefined1 (*) [32])((long)pvVar25 + lVar43 + lVar47);
            auVar59 = *(undefined1 (*) [32])((long)pvVar25 + lVar43 + lVar41);
            auVar60 = *(undefined1 (*) [32])((long)pvVar25 + lVar43 + lVar28);
            auVar3 = *(undefined1 (*) [32])((long)pvVar25 + lVar43 + lVar39);
            auVar4 = vunpcklps_avx(auVar2,auVar59);
            auVar59 = vunpckhps_avx(auVar2,auVar59);
            auVar2 = vunpcklps_avx(auVar60,auVar3);
            auVar60 = vunpckhps_avx(auVar60,auVar3);
            auVar3 = vunpcklpd_avx(auVar4,auVar2);
            auVar2 = vunpckhpd_avx(auVar4,auVar2);
            auVar4 = vunpcklpd_avx(auVar59,auVar60);
            auVar59 = vunpckhpd_avx(auVar59,auVar60);
            auVar60._16_16_ = auVar2._0_16_;
            auVar60._0_16_ = auVar3._0_16_;
            auVar61._16_16_ = auVar59._0_16_;
            auVar61._0_16_ = auVar4._0_16_;
            auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
            auVar59 = vperm2f128_avx(auVar4,auVar59,0x31);
            *pauVar27 = auVar60;
            pauVar27[1] = auVar61;
            pauVar27[2] = auVar2;
            pauVar27[3] = auVar59;
            lVar43 = lVar43 + 0x20;
            iVar42 = iVar42 + 8;
            pauVar27 = pauVar27 + 4;
          } while (iVar42 < max_kk);
          pauVar52 = pauVar34 + 4;
          lVar44 = lVar43 + lVar39;
          lVar29 = lVar43 + lVar28;
          lVar30 = lVar43 + lVar41;
          lVar43 = lVar43 + lVar47;
          uVar45 = max_kk & 0xfffffff8;
        }
        lVar43 = (long)pvVar25 + lVar43;
        lVar29 = (long)pvVar25 + lVar29;
        lVar30 = (long)pvVar25 + lVar30;
        lVar44 = (long)pvVar25 + lVar44;
        if ((int)(uVar45 | 3) < max_kk) {
          lVar50 = 0;
          pauVar27 = pauVar52;
          uVar37 = uVar45;
          do {
            pauVar34 = pauVar27;
            auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(lVar43 + lVar50),
                                    *(undefined1 (*) [16])(lVar30 + lVar50));
            auVar12 = vunpcklps_avx(*(undefined1 (*) [16])(lVar29 + lVar50),
                                    *(undefined1 (*) [16])(lVar44 + lVar50));
            auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(lVar43 + lVar50),
                                    *(undefined1 (*) [16])(lVar30 + lVar50));
            auVar18 = vunpckhps_avx(*(undefined1 (*) [16])(lVar29 + lVar50),
                                    *(undefined1 (*) [16])(lVar44 + lVar50));
            auVar8 = vmovlhps_avx(auVar17,auVar12);
            auVar12 = vunpckhpd_avx(auVar17,auVar12);
            auVar17 = vmovlhps_avx(auVar13,auVar18);
            auVar13 = vunpckhpd_avx(auVar13,auVar18);
            pauVar27 = (undefined1 (*) [32])(pauVar52[2] + lVar50 * 4);
            *(undefined1 (*) [16])pauVar27[-2] = auVar8;
            *(undefined1 (*) [16])(pauVar27[-2] + 0x10) = auVar12;
            *(undefined1 (*) [16])pauVar27[-1] = auVar17;
            *(undefined1 (*) [16])(pauVar27[-1] + 0x10) = auVar13;
            uVar45 = uVar37 + 4;
            lVar50 = lVar50 + 0x10;
            iVar42 = uVar37 + 7;
            uVar37 = uVar45;
          } while (iVar42 < max_kk);
          pauVar52 = pauVar34 + 2;
          lVar44 = lVar44 + lVar50;
          lVar29 = lVar29 + lVar50;
          lVar30 = lVar30 + lVar50;
          lVar43 = lVar43 + lVar50;
        }
        if ((int)uVar45 < max_kk) {
          lVar50 = 0;
          do {
            *(undefined4 *)*pauVar52 = *(undefined4 *)(lVar43 + lVar50 * 4);
            *(undefined4 *)(*pauVar52 + 4) = *(undefined4 *)(lVar30 + lVar50 * 4);
            *(undefined4 *)(*pauVar52 + 8) = *(undefined4 *)(lVar29 + lVar50 * 4);
            *(undefined4 *)(*pauVar52 + 0xc) = *(undefined4 *)(lVar44 + lVar50 * 4);
            pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
            lVar50 = lVar50 + 1;
          } while (max_kk - uVar45 != (int)lVar50);
        }
      }
      lVar44 = lVar32 + 4;
      lVar29 = lVar32 + 7;
      lVar39 = lVar39 + lVar40;
      lVar28 = lVar28 + lVar40;
      lVar41 = lVar41 + lVar40;
      lVar47 = lVar47 + lVar40;
      lVar32 = lVar44;
    } while (lVar29 < lVar54);
  }
  if ((int)((uint)lVar44 | 1) < max_jj) {
    lVar41 = (long)(int)(uint)lVar44;
    lVar39 = lVar58 * 4 + (lVar41 + lVar36 + 1) * lVar56 * 4;
    lVar28 = lVar58 * 4 + (lVar41 + lVar36) * lVar56 * 4;
    do {
      pvVar25 = B->data;
      if (max_kk < 8) {
        lVar47 = lVar58 * 4 + (lVar41 + lVar36) * lVar56 * 4;
        lVar44 = lVar58 * 4 + (lVar41 + lVar36 + 1) * lVar56 * 4;
        uVar45 = 0;
      }
      else {
        iVar35 = 7;
        lVar47 = 0;
        pauVar27 = pauVar52;
        do {
          pauVar34 = pauVar27;
          auVar2 = *(undefined1 (*) [32])((long)pvVar25 + lVar47 + lVar28);
          auVar59 = *(undefined1 (*) [32])((long)pvVar25 + lVar47 + lVar39);
          auVar60 = vunpcklps_avx(auVar2,auVar59);
          auVar2 = vunpckhps_avx(auVar2,auVar59);
          auVar59._16_16_ = auVar2._0_16_;
          auVar59._0_16_ = auVar60._0_16_;
          auVar2 = vperm2f128_avx(auVar60,auVar2,0x31);
          pauVar27 = (undefined1 (*) [32])(*pauVar52 + lVar47 * 2);
          *pauVar27 = auVar59;
          pauVar27[1] = auVar2;
          lVar47 = lVar47 + 0x20;
          iVar35 = iVar35 + 8;
          pauVar27 = pauVar27 + 2;
        } while (iVar35 < max_kk);
        pauVar52 = pauVar34 + 2;
        lVar44 = lVar47 + lVar39;
        lVar47 = lVar47 + lVar28;
        uVar45 = max_kk & 0xfffffff8;
      }
      pauVar51 = (undefined1 (*) [16])((long)pvVar25 + lVar47);
      pauVar48 = (undefined1 (*) [16])((long)pvVar25 + lVar44);
      uVar37 = uVar45 | 3;
      while ((int)uVar37 < max_kk) {
        auVar17 = vunpcklps_avx(*pauVar51,*pauVar48);
        auVar8 = vunpckhps_avx(*pauVar51,*pauVar48);
        *(undefined1 (*) [16])*pauVar52 = auVar17;
        *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar8;
        pauVar52 = pauVar52 + 1;
        pauVar51 = pauVar51 + 1;
        pauVar48 = pauVar48 + 1;
        uVar37 = uVar45 + 7;
        uVar45 = uVar45 + 4;
      }
      if ((int)uVar45 < max_kk) {
        lVar44 = 0;
        do {
          *(undefined4 *)*pauVar52 = *(undefined4 *)(*pauVar51 + lVar44 * 4);
          *(undefined4 *)(*pauVar52 + 4) = *(undefined4 *)(*pauVar48 + lVar44 * 4);
          pauVar52 = (undefined1 (*) [32])(*pauVar52 + 8);
          lVar44 = lVar44 + 1;
        } while (max_kk - uVar45 != (int)lVar44);
      }
      lVar44 = lVar41 + 2;
      lVar47 = lVar41 + 3;
      lVar39 = lVar39 + lVar56 * 8;
      lVar28 = lVar28 + lVar56 * 8;
      lVar41 = lVar44;
    } while (lVar47 < lVar54);
  }
  if ((int)lVar44 < max_jj) {
    lVar44 = (long)(int)lVar44;
    do {
      pauVar27 = (undefined1 (*) [32])((long)B->data + lVar58 * 4 + (lVar44 + lVar36) * lVar56 * 4);
      if (max_kk < 8) {
        uVar45 = 0;
      }
      else {
        iVar35 = 7;
        do {
          *pauVar52 = *pauVar27;
          pauVar52 = pauVar52 + 1;
          pauVar27 = pauVar27 + 1;
          iVar35 = iVar35 + 8;
          uVar45 = max_kk & 0xfffffff8;
        } while (iVar35 < max_kk);
      }
      uVar37 = uVar45 | 3;
      while ((int)uVar37 < max_kk) {
        *(undefined1 (*) [16])*pauVar52 = *(undefined1 (*) [16])*pauVar27;
        pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
        uVar37 = uVar45 + 7;
        uVar45 = uVar45 + 4;
      }
      if ((int)uVar45 < max_kk) {
        lVar39 = 0;
        lVar28 = 0;
        do {
          *(undefined4 *)(*pauVar52 + lVar28 * 4) = *(undefined4 *)(*pauVar27 + lVar28 * 4);
          lVar28 = lVar28 + 1;
          lVar39 = lVar39 + -4;
        } while (max_kk - uVar45 != (int)lVar28);
        pauVar52 = (undefined1 (*) [32])((long)pauVar52 - lVar39);
      }
      lVar44 = lVar44 + 1;
    } while (lVar44 != lVar54);
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}